

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_regs.h
# Opt level: O0

void hreg_swap_gpr_tgpr(CPUPPCState_conflict2 *env)

{
  target_ulong tVar1;
  target_ulong tmp;
  CPUPPCState_conflict2 *env_local;
  
  tVar1 = env->gpr[0];
  env->gpr[0] = env->tgpr[0];
  env->tgpr[0] = tVar1;
  tVar1 = env->gpr[1];
  env->gpr[1] = env->tgpr[1];
  env->tgpr[1] = tVar1;
  tVar1 = env->gpr[2];
  env->gpr[2] = env->tgpr[2];
  env->tgpr[2] = tVar1;
  tVar1 = env->gpr[3];
  env->gpr[3] = env->tgpr[3];
  env->tgpr[3] = tVar1;
  return;
}

Assistant:

static inline void hreg_swap_gpr_tgpr(CPUPPCState *env)
{
    target_ulong tmp;

    tmp = env->gpr[0];
    env->gpr[0] = env->tgpr[0];
    env->tgpr[0] = tmp;
    tmp = env->gpr[1];
    env->gpr[1] = env->tgpr[1];
    env->tgpr[1] = tmp;
    tmp = env->gpr[2];
    env->gpr[2] = env->tgpr[2];
    env->tgpr[2] = tmp;
    tmp = env->gpr[3];
    env->gpr[3] = env->tgpr[3];
    env->tgpr[3] = tmp;
}